

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

string * __thiscall
cppwinrt::get_field_abi_abi_cxx11_
          (string *__return_storage_ptr__,cppwinrt *this,writer *w,Field *field)

{
  bool bVar1;
  value_type *__v;
  coded_index<winmd::reader::TypeDefOrRef> *pcVar2;
  Field *pFVar3;
  table_base *field_00;
  TypeDef TVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  writer *local_198;
  value_type *nested;
  Field __end2;
  Field __begin2;
  TypeDef local_160;
  pair<winmd::reader::Field,_winmd::reader::Field> local_150;
  pair<winmd::reader::Field,_winmd::reader::Field> *local_130;
  pair<winmd::reader::Field,_winmd::reader::Field> *__range2;
  coded_index<winmd::reader::TypeDefOrRef> ref;
  string_view local_108 [2];
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined1 local_d1;
  TypeSig *local_d0;
  TypeSig *type;
  FieldSig signature;
  Field *field_local;
  writer *w_local;
  string *name;
  
  signature.m_type.m_array_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)w;
  winmd::reader::Field::Signature((FieldSig *)&type,(Field *)w);
  local_d0 = winmd::reader::FieldSig::Type((FieldSig *)&type);
  local_d1 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"%");
  writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
            (__return_storage_ptr__,(writer_base<cppwinrt::writer> *)this,&local_e8,local_d0);
  local_108[0] = (string_view)
                 ::std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &ref.super_typed_index<winmd::reader::TypeDefOrRef>.
              super_index_base<winmd::reader::TypeDefOrRef>.m_value,"struct ");
  bVar1 = starts_with(local_108,
                      (string_view *)
                      &ref.super_typed_index<winmd::reader::TypeDefOrRef>.
                       super_index_base<winmd::reader::TypeDefOrRef>.m_value);
  if (bVar1) {
    __v = winmd::reader::TypeSig::Type(local_d0);
    pcVar2 = ::std::
             get<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                       (__v);
    __range2 = (pair<winmd::reader::Field,_winmd::reader::Field> *)
               (pcVar2->super_typed_index<winmd::reader::TypeDefOrRef>).
               super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    ref.super_typed_index<winmd::reader::TypeDefOrRef>.super_index_base<winmd::reader::TypeDefOrRef>
    .m_table = *(table_base **)
                &(pcVar2->super_typed_index<winmd::reader::TypeDefOrRef>).
                 super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"struct{");
    TVar4 = winmd::reader::find_required((coded_index<winmd::reader::TypeDefOrRef> *)&__range2);
    local_160.super_row_base<winmd::reader::TypeDef>.m_table =
         TVar4.super_row_base<winmd::reader::TypeDef>.m_table;
    local_160.super_row_base<winmd::reader::TypeDef>.m_index =
         TVar4.super_row_base<winmd::reader::TypeDef>.m_index;
    winmd::reader::TypeDef::FieldList(&local_150,&local_160);
    local_130 = &local_150;
    pFVar3 = winmd::reader::begin<winmd::reader::Field>(local_130);
    __end2.super_row_base<winmd::reader::Field>._8_8_ =
         (pFVar3->super_row_base<winmd::reader::Field>).m_table;
    pFVar3 = winmd::reader::end<winmd::reader::Field>(local_130);
    field_00 = (pFVar3->super_row_base<winmd::reader::Field>).m_table;
    __end2.super_row_base<winmd::reader::Field>.m_table =
         *(table_base **)&(pFVar3->super_row_base<winmd::reader::Field>).m_index;
    nested = (value_type *)field_00;
    while( true ) {
      bVar1 = winmd::reader::row_base<winmd::reader::Field>::operator!=
                        ((row_base<winmd::reader::Field> *)
                         &__end2.super_row_base<winmd::reader::Field>.m_index,
                         (row_base<winmd::reader::Field> *)&nested);
      if (!bVar1) break;
      local_198 = (writer *)
                  winmd::reader::row_base<winmd::reader::Field>::operator*
                            ((row_base<winmd::reader::Field> *)
                             &__end2.super_row_base<winmd::reader::Field>.m_index);
      get_field_abi_abi_cxx11_(&local_1f8,this,local_198,(Field *)field_00);
      ::std::operator+(&local_1d8," ",&local_1f8);
      ::std::operator+(&local_1b8,&local_1d8," ");
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b8);
      ::std::__cxx11::string::~string((string *)&local_1b8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      sVar5 = winmd::reader::Field::Name((Field *)local_198);
      local_208._M_str = sVar5._M_str;
      field_00 = (table_base *)sVar5._M_len;
      local_208._M_len = (size_t)field_00;
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_208);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
      winmd::reader::row_base<winmd::reader::Field>::operator++
                ((row_base<winmd::reader::Field> *)
                 &__end2.super_row_base<winmd::reader::Field>.m_index);
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__," }");
  }
  local_d1 = 1;
  winmd::reader::FieldSig::~FieldSig((FieldSig *)&type);
  return __return_storage_ptr__;
}

Assistant:

static std::string get_field_abi(writer& w, Field const& field)
    {
        auto signature = field.Signature();
        auto const& type = signature.Type();
        std::string name = w.write_temp("%", type);

        if (starts_with(name, "struct "))
        {
            auto ref = std::get<coded_index<TypeDefOrRef>>(type.Type());

            name = "struct{";

            for (auto&& nested : find_required(ref).FieldList())
            {
                name += " " + get_field_abi(w, nested) + " ";
                name += nested.Name();
                name += ";";
            }

            name += " }";
        }

        return name;
    }